

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode singlesocket(Curl_multi *multi,Curl_easy *data)

{
  int *piVar1;
  int iVar2;
  curl_socket_callback p_Var3;
  byte bVar4;
  Curl_easy *pCVar5;
  Curl_multi *pCVar6;
  uint uVar7;
  int iVar8;
  curl_hash *pcVar9;
  void *pvVar10;
  ulong uVar11;
  size_t key_len;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  Curl_easy **key;
  size_t __n;
  uint uVar16;
  int iVar17;
  long lVar18;
  bool bVar19;
  curl_socket_t socks [5];
  int actions [5];
  undefined1 local_94 [4];
  Curl_easy *local_90;
  curl_hash *local_88;
  uint local_7c;
  Curl_multi *local_78;
  int local_6c;
  curl_socket_t local_68 [8];
  uint local_48 [6];
  
  local_68[0] = -1;
  local_68[1] = 0xffffffff;
  local_68[2] = 0xffffffff;
  local_68[3] = 0xffffffff;
  local_68[4] = 0xffffffff;
  local_90 = data;
  local_78 = multi;
  uVar7 = multi_getsock(data,local_68);
  local_88 = &multi->sockhash;
  uVar12 = 0;
  do {
    bVar4 = (byte)uVar12;
    uVar16 = 0x10000 << (bVar4 & 0x1f);
    if ((uVar7 >> (bVar4 & 0x1f) & 0x10001) == 0) goto LAB_0012aad8;
    uVar13 = 1 << (bVar4 & 0x1f);
    iVar2 = local_68[uVar12];
    local_94 = (undefined1  [4])iVar2;
    if (iVar2 == -1) {
      pcVar9 = (curl_hash *)0x0;
    }
    else {
      pcVar9 = (curl_hash *)Curl_hash_pick(local_88,local_94,4);
    }
    bVar19 = (uVar13 & uVar7) != 0;
    uVar14 = bVar19 + 2;
    if ((uVar16 & uVar7) == 0) {
      uVar14 = (uint)bVar19;
    }
    local_48[uVar12] = uVar14;
    local_7c = uVar13;
    if (pcVar9 == (curl_hash *)0x0) {
      local_6c = iVar2;
      if (iVar2 == -1) {
        pcVar9 = (curl_hash *)0x0;
        local_94 = (undefined1  [4])iVar2;
      }
      else {
        local_94 = (undefined1  [4])iVar2;
        pcVar9 = (curl_hash *)Curl_hash_pick(local_88,local_94,4);
      }
      if (pcVar9 == (curl_hash *)0x0) {
        pcVar9 = (curl_hash *)(*Curl_ccalloc)(1,0x50);
        if (pcVar9 != (curl_hash *)0x0) {
          iVar8 = Curl_hash_init(pcVar9,0xd,trhash,trhash_compare,trhash_dtor);
          if (iVar8 == 0) {
            pvVar10 = Curl_hash_add(local_88,&local_6c,4,pcVar9);
            if (pvVar10 != (void *)0x0) goto LAB_0012a9b0;
            Curl_hash_destroy(pcVar9);
          }
          (*Curl_cfree)(pcVar9);
        }
        pcVar9 = (curl_hash *)0x0;
      }
LAB_0012a9b0:
      uVar13 = 0;
      bVar19 = false;
      if (pcVar9 != (curl_hash *)0x0) goto LAB_0012a9c1;
LAB_0012aa85:
      iVar8 = 1;
    }
    else {
      uVar11 = (ulong)local_90->numsocks;
      uVar13 = 0;
      bVar19 = 0 < (long)uVar11;
      if (0 < (long)uVar11) {
        uVar15 = 0;
        do {
          if (iVar2 == local_90->sockets[uVar15]) {
            uVar13 = local_90->actions[uVar15];
            bVar19 = true;
            goto LAB_0012a9c1;
          }
          uVar15 = uVar15 + 1;
        } while (uVar11 != uVar15);
        bVar19 = uVar15 < uVar11;
      }
LAB_0012a9c1:
      pCVar6 = local_78;
      if ((bVar19) && (uVar13 != uVar14)) {
        if ((uVar13 & 1) != 0) {
          piVar1 = (int *)((long)&pcVar9[1].comp_func + 4);
          *piVar1 = *piVar1 + -1;
        }
        if ((uVar13 & 2) != 0) {
          *(int *)&pcVar9[1].dtor = *(int *)&pcVar9[1].dtor + -1;
        }
        if ((local_7c & uVar7) != 0) {
          piVar1 = (int *)((long)&pcVar9[1].comp_func + 4);
          *piVar1 = *piVar1 + 1;
        }
        if ((uVar16 & uVar7) != 0) {
          *(int *)&pcVar9[1].dtor = *(int *)&pcVar9[1].dtor + 1;
        }
      }
      else if (!bVar19) {
        *(int *)&pcVar9[1].comp_func = *(int *)&pcVar9[1].comp_func + 1;
        if ((local_7c & uVar7) != 0) {
          piVar1 = (int *)((long)&pcVar9[1].comp_func + 4);
          *piVar1 = *piVar1 + 1;
        }
        if ((uVar16 & uVar7) != 0) {
          *(int *)&pcVar9[1].dtor = *(int *)&pcVar9[1].dtor + 1;
        }
        pvVar10 = Curl_hash_add(pcVar9,&local_90,8,local_90);
        if (pvVar10 == (void *)0x0) goto LAB_0012aa85;
      }
      iVar17 = (uint)(*(int *)((long)&pcVar9[1].comp_func + 4) != 0) +
               (uint)(*(int *)&pcVar9[1].dtor != 0) * 2;
      if ((!bVar19) || (iVar8 = 7, *(int *)&pcVar9[1].table != iVar17)) {
        p_Var3 = pCVar6->socket_cb;
        if (p_Var3 != (curl_socket_callback)0x0) {
          (*p_Var3)(local_90,iVar2,iVar17,pCVar6->socket_userp,pcVar9[1].hash_func);
        }
        *(int *)&pcVar9[1].table = iVar17;
        iVar8 = 0;
      }
    }
    if ((iVar8 != 7) && (iVar8 != 0)) {
      return CURLM_OUT_OF_MEMORY;
    }
    uVar12 = uVar12 + 1;
  } while (uVar12 != 5);
  uVar12 = 5;
LAB_0012aad8:
  if (0 < local_90->numsocks) {
    lVar18 = 0;
    do {
      iVar2 = local_90->sockets[lVar18];
      if ((int)uVar12 != 0) {
        uVar11 = 0;
        do {
          if (iVar2 == local_68[uVar11]) goto LAB_0012abb6;
          uVar11 = uVar11 + 1;
        } while ((uVar12 & 0xffffffff) != uVar11);
      }
      local_94 = (undefined1  [4])iVar2;
      if (iVar2 == -1) {
        pcVar9 = (curl_hash *)0x0;
      }
      else {
        pcVar9 = (curl_hash *)Curl_hash_pick(local_88,local_94,4);
      }
      if (pcVar9 != (curl_hash *)0x0) {
        uVar7 = local_90->actions[lVar18];
        iVar8 = *(int *)&pcVar9[1].comp_func + -1;
        *(int *)&pcVar9[1].comp_func = iVar8;
        if ((uVar7 & 2) != 0) {
          *(int *)&pcVar9[1].dtor = *(int *)&pcVar9[1].dtor + -1;
        }
        if ((uVar7 & 1) != 0) {
          piVar1 = (int *)((long)&pcVar9[1].comp_func + 4);
          *piVar1 = *piVar1 + -1;
        }
        if (iVar8 == 0) {
          if (local_78->socket_cb != (curl_socket_callback)0x0) {
            (*local_78->socket_cb)(local_90,iVar2,4,local_78->socket_userp,pcVar9[1].hash_func);
          }
          local_94 = (undefined1  [4])iVar2;
          Curl_hash_destroy(pcVar9);
          key_len = 4;
          key = (Curl_easy **)local_94;
          pcVar9 = local_88;
        }
        else {
          key_len = 8;
          key = &local_90;
        }
        Curl_hash_delete(pcVar9,key,key_len);
      }
LAB_0012abb6:
      lVar18 = lVar18 + 1;
    } while (lVar18 < local_90->numsocks);
  }
  pCVar5 = local_90;
  __n = (uVar12 & 0xffffffff) << 2;
  memcpy(local_90->sockets,local_68,__n);
  memcpy(pCVar5->actions,local_48,__n);
  pCVar5->numsocks = (int)uVar12;
  return CURLM_OK;
}

Assistant:

static CURLMcode singlesocket(struct Curl_multi *multi,
                              struct Curl_easy *data)
{
  curl_socket_t socks[MAX_SOCKSPEREASYHANDLE];
  int i;
  struct Curl_sh_entry *entry;
  curl_socket_t s;
  int num;
  unsigned int curraction;
  int actions[MAX_SOCKSPEREASYHANDLE];

  for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++)
    socks[i] = CURL_SOCKET_BAD;

  /* Fill in the 'current' struct with the state as it is now: what sockets to
     supervise and for what actions */
  curraction = multi_getsock(data, socks);

  /* We have 0 .. N sockets already and we get to know about the 0 .. M
     sockets we should have from now on. Detect the differences, remove no
     longer supervised ones and add new ones */

  /* walk over the sockets we got right now */
  for(i = 0; (i< MAX_SOCKSPEREASYHANDLE) &&
        (curraction & (GETSOCK_READSOCK(i) | GETSOCK_WRITESOCK(i)));
      i++) {
    unsigned int action = CURL_POLL_NONE;
    unsigned int prevaction = 0;
    unsigned int comboaction;
    bool sincebefore = FALSE;

    s = socks[i];

    /* get it from the hash */
    entry = sh_getentry(&multi->sockhash, s);

    if(curraction & GETSOCK_READSOCK(i))
      action |= CURL_POLL_IN;
    if(curraction & GETSOCK_WRITESOCK(i))
      action |= CURL_POLL_OUT;

    actions[i] = action;
    if(entry) {
      /* check if new for this transfer */
      int j;
      for(j = 0; j< data->numsocks; j++) {
        if(s == data->sockets[j]) {
          prevaction = data->actions[j];
          sincebefore = TRUE;
          break;
        }
      }
    }
    else {
      /* this is a socket we didn't have before, add it to the hash! */
      entry = sh_addentry(&multi->sockhash, s);
      if(!entry)
        /* fatal */
        return CURLM_OUT_OF_MEMORY;
    }
    if(sincebefore && (prevaction != action)) {
      /* Socket was used already, but different action now */
      if(prevaction & CURL_POLL_IN)
        entry->readers--;
      if(prevaction & CURL_POLL_OUT)
        entry->writers--;
      if(action & CURL_POLL_IN)
        entry->readers++;
      if(action & CURL_POLL_OUT)
        entry->writers++;
    }
    else if(!sincebefore) {
      /* a new user */
      entry->users++;
      if(action & CURL_POLL_IN)
        entry->readers++;
      if(action & CURL_POLL_OUT)
        entry->writers++;

      /* add 'data' to the transfer hash on this socket! */
      if(!Curl_hash_add(&entry->transfers, (char *)&data, /* hash key */
                        sizeof(struct Curl_easy *), data))
        return CURLM_OUT_OF_MEMORY;
    }

    comboaction = (entry->writers? CURL_POLL_OUT : 0) |
      (entry->readers ? CURL_POLL_IN : 0);

    /* socket existed before and has the same action set as before */
    if(sincebefore && (entry->action == comboaction))
      /* same, continue */
      continue;

    if(multi->socket_cb)
      multi->socket_cb(data, s, comboaction, multi->socket_userp,
                       entry->socketp);

    entry->action = comboaction; /* store the current action state */
  }

  num = i; /* number of sockets */

  /* when we've walked over all the sockets we should have right now, we must
     make sure to detect sockets that are removed */
  for(i = 0; i< data->numsocks; i++) {
    int j;
    bool stillused = FALSE;
    s = data->sockets[i];
    for(j = 0; j < num; j++) {
      if(s == socks[j]) {
        /* this is still supervised */
        stillused = TRUE;
        break;
      }
    }
    if(stillused)
      continue;

    entry = sh_getentry(&multi->sockhash, s);
    /* if this is NULL here, the socket has been closed and notified so
       already by Curl_multi_closed() */
    if(entry) {
      int oldactions = data->actions[i];
      /* this socket has been removed. Decrease user count */
      entry->users--;
      if(oldactions & CURL_POLL_OUT)
        entry->writers--;
      if(oldactions & CURL_POLL_IN)
        entry->readers--;
      if(!entry->users) {
        if(multi->socket_cb)
          multi->socket_cb(data, s, CURL_POLL_REMOVE,
                           multi->socket_userp,
                           entry->socketp);
        sh_delentry(entry, &multi->sockhash, s);
      }
      else {
        /* still users, but remove this handle as a user of this socket */
        if(Curl_hash_delete(&entry->transfers, (char *)&data,
                            sizeof(struct Curl_easy *))) {
          DEBUGASSERT(NULL);
        }
      }
    }
  } /* for loop over numsocks */

  memcpy(data->sockets, socks, num*sizeof(curl_socket_t));
  memcpy(data->actions, actions, num*sizeof(int));
  data->numsocks = num;
  return CURLM_OK;
}